

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,Script *script)

{
  ByteData local_30;
  Script *local_18;
  Script *script_local;
  HashUtil *this_local;
  
  local_18 = script;
  script_local = (Script *)this;
  Script::GetData(&local_30,script);
  ByteData::Push(&this->buffer_,&local_30);
  ByteData::~ByteData((ByteData *)0x3ed159);
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const Script &script) {
  buffer_.Push(script.GetData());
  return *this;
}